

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowReturnOneRow(WindowCodeArg *p)

{
  Window **ppWVar1;
  int p2;
  Parse *pParse_00;
  Window *pMWin;
  Vdbe *p_00;
  FuncDef *pFVar2;
  char *pcVar3;
  byte bVar4;
  u8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  KeyInfo *p_01;
  Op *pOVar9;
  int iVar10;
  int iVar11;
  int op;
  Window *pWin;
  Window *pWVar12;
  int iVar13;
  Parse *pParse;
  int local_78;
  int local_68;
  int local_64;
  
  pParse_00 = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  pWVar12 = pMWin;
  if (pMWin->regStartRowid == 0) {
    do {
      pFVar2 = pWVar12->pFunc;
      pcVar3 = pFVar2->zName;
      if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
        iVar11 = pWVar12->csrApp;
        iVar8 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar8;
        if (pParse_00->nTempReg == '\0') {
          iVar13 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar13;
        }
        else {
          bVar4 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar4;
          iVar13 = pParse_00->aTempReg[bVar4];
        }
        sqlite3VdbeAddOp3(p_00,0x49,0,pWVar12->regResult,0);
        if (pFVar2->zName == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5a,pMWin->iEphCsr,pWVar12->iArgCol + 1,iVar13);
          windowCheckValue(pParse_00,iVar13,2);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x46,1,iVar13,0);
        }
        sqlite3VdbeAddOp3(p_00,100,iVar13,pWVar12->regApp,iVar13);
        sqlite3VdbeAddOp3(p_00,0x36,pWVar12->regApp + 1,iVar8,iVar13);
        sqlite3VdbeAddOp3(p_00,0x1e,iVar11,0,iVar13);
        sqlite3VdbeAddOp3(p_00,0x5a,iVar11,pWVar12->iArgCol,pWVar12->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar8);
        if (iVar13 != 0) {
          bVar4 = pParse_00->nTempReg;
joined_r0x0018eed9:
          if (bVar4 < 8) {
            pParse_00->nTempReg = bVar4 + 1;
            pParse_00->aTempReg[bVar4] = iVar13;
          }
        }
      }
      else {
        if (pcVar3 != "lead" && pcVar3 != "lag") goto LAB_0018eeeb;
        iVar11 = ((pWVar12->pOwner->x).pList)->nExpr;
        iVar8 = pWVar12->csrApp;
        iVar6 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar6;
        if (pParse_00->nTempReg == '\0') {
          iVar13 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar13;
        }
        else {
          bVar4 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar4;
          iVar13 = pParse_00->aTempReg[bVar4];
        }
        iVar7 = pMWin->iEphCsr;
        if (iVar11 < 3) {
          sqlite3VdbeAddOp3(p_00,0x49,0,pWVar12->regResult,0);
          sqlite3VdbeAddOp3(p_00,0x80,iVar7,iVar13,0);
          if (iVar11 == 2) goto LAB_0018edf4;
          sqlite3VdbeAddOp3(p_00,0x53,iVar13,(uint)(pFVar2->zName == "lead") * 2 + -1,0);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x5a,iVar7,pWVar12->iArgCol + 2,pWVar12->regResult);
          sqlite3VdbeAddOp3(p_00,0x80,iVar7,iVar13,0);
LAB_0018edf4:
          pcVar3 = pFVar2->zName;
          if (pParse_00->nTempReg == '\0') {
            iVar11 = pParse_00->nMem + 1;
            pParse_00->nMem = iVar11;
          }
          else {
            bVar4 = pParse_00->nTempReg - 1;
            pParse_00->nTempReg = bVar4;
            iVar11 = pParse_00->aTempReg[bVar4];
          }
          sqlite3VdbeAddOp3(p_00,0x5a,iVar7,pWVar12->iArgCol + 1,iVar11);
          sqlite3VdbeAddOp3(p_00,pcVar3 == "lead" ^ 0x65,iVar11,iVar13,iVar13);
          if (iVar11 != 0) {
            bVar4 = pParse_00->nTempReg;
            if ((ulong)bVar4 < 8) {
              pParse_00->nTempReg = bVar4 + 1;
              pParse_00->aTempReg[bVar4] = iVar11;
            }
          }
        }
        sqlite3VdbeAddOp3(p_00,0x1e,iVar8,iVar6,iVar13);
        sqlite3VdbeAddOp3(p_00,0x5a,iVar8,pWVar12->iArgCol,pWVar12->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar6);
        if (iVar13 != 0) {
          bVar4 = pParse_00->nTempReg;
          goto joined_r0x0018eed9;
        }
      }
LAB_0018eeeb:
      ppWVar1 = &pWVar12->pNextWin;
      pWVar12 = *ppWVar1;
    } while (*ppWVar1 != (Window *)0x0);
    goto LAB_0018f30a;
  }
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = pMWin->pOrderBy->nExpr;
  }
  iVar6 = pMWin->csrApp;
  iVar13 = pParse_00->nLabel;
  iVar8 = iVar13 + -2;
  pParse_00->nLabel = iVar8;
  uVar5 = pParse_00->nTempReg;
  if (uVar5 == '\0') {
    iVar7 = pParse_00->nMem + 1;
    local_78 = iVar7;
LAB_0018ef50:
    iVar7 = iVar7 + 1;
    pParse_00->nMem = iVar7;
  }
  else {
    bVar4 = uVar5 - 1;
    pParse_00->nTempReg = bVar4;
    local_78 = pParse_00->aTempReg[bVar4];
    if (bVar4 == 0) {
      iVar7 = pParse_00->nMem;
      goto LAB_0018ef50;
    }
    pParse_00->nTempReg = uVar5 - 2;
    iVar7 = pParse_00->aTempReg[(byte)(uVar5 - 2)];
  }
  if (iVar11 == 0) {
    local_68 = 0;
    local_64 = 0;
  }
  else {
    local_64 = sqlite3GetTempRange(pParse_00,iVar11);
    local_68 = sqlite3GetTempRange(pParse_00,iVar11);
  }
  iVar13 = iVar13 + -1;
  sqlite3VdbeAddOp3(p_00,0x80,pMWin->iEphCsr,local_78,0);
  windowReadPeerValues(p,pMWin->iEphCsr,local_64);
  do {
    sqlite3VdbeAddOp3(p_00,0x49,0,pWVar12->regAccum,0);
    pWVar12 = pWVar12->pNextWin;
  } while (pWVar12 != (Window *)0x0);
  sqlite3VdbeAddOp3(p_00,0x18,iVar6,iVar8,pMWin->regStartRowid);
  p2 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x80,iVar6,iVar7,0);
  sqlite3VdbeAddOp3(p_00,0x36,pMWin->regEndRowid,iVar8,iVar7);
  uVar5 = pMWin->eExclude;
  if (uVar5 != 'B') {
    if (uVar5 == 'R') {
      sqlite3VdbeAddOp3(p_00,0x35,local_78,iVar13,iVar7);
    }
    else {
      iVar8 = 0;
      if (pMWin->pOrderBy == (ExprList *)0x0) {
        p_01 = (KeyInfo *)0x0;
      }
      else {
        p_01 = sqlite3KeyInfoFromExprList(pParse_00,pMWin->pOrderBy,0,0);
        uVar5 = pMWin->eExclude;
      }
      if (uVar5 == '[') {
        iVar8 = sqlite3VdbeAddOp3(p_00,0x35,local_78,0,iVar7);
      }
      if (p_01 == (KeyInfo *)0x0) {
        op = 0xb;
        iVar10 = 0;
      }
      else {
        windowReadPeerValues(p,iVar6,local_68);
        sqlite3VdbeAddOp3(p_00,0x57,local_68,local_64,iVar11);
        if (p_00->db->mallocFailed == '\0') {
          pOVar9 = p_00->aOp;
          iVar10 = p_00->nOp;
          pOVar9[(long)iVar10 + -1].p4type = -9;
          pOVar9[(long)iVar10 + -1].p4.pKeyInfo = p_01;
        }
        else if ((p_00->db->pnBytesFreed == (int *)0x0) &&
                (p_01->nRef = p_01->nRef - 1, p_01->nRef == 0)) {
          sqlite3DbFreeNN(p_01->db,p_01);
        }
        iVar10 = p_00->nOp + 1;
        op = 0x10;
      }
      sqlite3VdbeAddOp3(p_00,op,iVar10,iVar13,iVar10);
      if (iVar8 != 0) {
        if (p_00->db->mallocFailed == '\0') {
          iVar10 = p_00->nOp + -1;
          if (-1 < iVar8) {
            iVar10 = iVar8;
          }
          pOVar9 = p_00->aOp + iVar10;
        }
        else {
          pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar9->p2 = p_00->nOp;
      }
    }
  }
  windowAggStep(pParse_00,pMWin,iVar6,0,p->regArg);
  sqlite3VdbeResolveLabel(p_00,iVar13);
  sqlite3VdbeAddOp3(p_00,5,iVar6,p2,0);
  iVar8 = p_00->nOp;
  if (p_00->db->mallocFailed == '\0') {
    iVar6 = p2;
    if (p2 < 1) {
      iVar6 = iVar8;
    }
    pOVar9 = p_00->aOp;
    iVar13 = iVar8 + -1;
    if (-2 < p2) {
      iVar13 = p2 + 1;
    }
    pOVar9[(long)iVar6 + -1].p2 = iVar8;
    pOVar9 = pOVar9 + iVar13;
  }
  else {
    pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    DAT_001d9be0 = iVar8;
  }
  pOVar9->p2 = iVar8;
  if (iVar7 != 0) {
    bVar4 = pParse_00->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse_00->nTempReg = bVar4 + 1;
      pParse_00->aTempReg[bVar4] = iVar7;
    }
  }
  if (local_78 != 0) {
    bVar4 = pParse_00->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse_00->nTempReg = bVar4 + 1;
      pParse_00->aTempReg[bVar4] = local_78;
    }
  }
  if (iVar11 != 0) {
    if (iVar11 == 1) {
      if (local_68 != 0) {
        bVar4 = pParse_00->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse_00->nTempReg = bVar4 + 1;
          pParse_00->aTempReg[bVar4] = local_68;
        }
      }
      if (local_64 != 0) {
        bVar4 = pParse_00->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse_00->nTempReg = bVar4 + 1;
          pParse_00->aTempReg[bVar4] = local_64;
        }
      }
    }
    else if (pParse_00->nRangeReg < iVar11) {
      pParse_00->nRangeReg = iVar11;
      pParse_00->iRangeReg = local_68;
    }
  }
  windowAggFinal((WindowCodeArg *)p->pParse,(int)p->pMWin);
LAB_0018f30a:
  sqlite3VdbeAddOp3(p_00,0xc,p->regGosub,p->addrGosub,0);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pFunc;
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
  
        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;
  
        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }
  
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}